

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int av1_txfm_search(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,RD_STATS *rd_stats,
                   RD_STATS *rd_stats_y,RD_STATS *rd_stats_uv,int mode_rate,int64_t ref_best_rd)

{
  int iVar1;
  long lVar2;
  QUANTS *pQVar3;
  int16_t iVar4;
  int16_t iVar5;
  int16_t iVar6;
  int iVar7;
  MACROBLOCK *x_00;
  RD_STATS *rd_stats_00;
  RD_STATS *pRVar8;
  RD_STATS *pRVar9;
  RD_STATS *in_RCX;
  long in_RSI;
  long in_RDI;
  RD_STATS *in_R8;
  AV1_COMP *in_R9;
  int in_stack_00000008;
  long in_stack_00000010;
  int64_t tmprd;
  int64_t rdcost_skip_txfm;
  int64_t rdcost_no_skip_txfm;
  int choose_skip_txfm;
  int is_cost_valid_uv;
  int64_t ref_best_chroma_rd;
  int num_planes;
  int64_t min_rdcosty;
  int64_t skip_txfm_rdcosty;
  int64_t non_skip_txfm_rdcosty;
  int i;
  int64_t rd_thresh;
  int64_t mode_rd;
  MB_MODE_INFO *mbmi;
  AV1_COMMON *cm;
  int64_t min_header_rd_possible;
  int64_t min_header_rate;
  int skip_txfm_cost [2];
  int skip_ctx;
  TxfmSearchParams *txfm_params;
  MACROBLOCKD *xd;
  RD_STATS *in_stack_fffffffffffffef8;
  RD_STATS *in_stack_ffffffffffffff00;
  RD_STATS *local_f0;
  int local_e0;
  undefined8 in_stack_ffffffffffffff38;
  uint8_t uVar10;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff58;
  BLOCK_SIZE bs;
  RD_STATS *in_stack_ffffffffffffff60;
  MACROBLOCK *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int blk_idx;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar11;
  BLOCK_SIZE bsize_00;
  int local_4;
  
  bs = (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  x_00 = (MACROBLOCK *)(in_RSI + 0x1a0);
  rd_stats_00 = (RD_STATS *)(in_RSI + 0x24dcc);
  iVar7 = av1_get_skip_txfm_context((MACROBLOCKD *)x_00);
  iVar11 = *(int *)(in_RSI + 0x8c80 + (long)iVar7 * 8);
  iVar1 = *(int *)(in_RSI + 0x8c84 + (long)iVar7 * 8);
  local_e0 = iVar1;
  if (iVar11 < iVar1) {
    local_e0 = iVar11;
  }
  if (in_stack_00000010 <
      (long)(in_stack_00000008 + local_e0) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) {
    av1_invalid_rd_stats(in_R8);
    local_4 = 0;
  }
  else {
    lVar2 = *(long *)(x_00->e_mbd).plane[2].seg_qmatrix[5][8];
    av1_init_rd_stats(in_RCX);
    av1_init_rd_stats(in_R8);
    in_RCX->rate = in_stack_00000008;
    av1_subtract_plane((MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff38 >> 0x38),
                       (int)in_stack_ffffffffffffff38);
    bsize_00 = (BLOCK_SIZE)((uint)iVar7 >> 0x18);
    if ((rd_stats_00->field_0x24 == '\x02') &&
       (*(int *)((x_00->e_mbd).weight[6] + (ulong)((byte)*(undefined2 *)(lVar2 + 0xa7) & 7) * 2 + 6)
        == 0)) {
      av1_pick_recursive_tx_size_type_yrd
                ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,bs,
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    }
    else {
      av1_pick_uniform_tx_size_type_yrd
                ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,bs,
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      memset((void *)(lVar2 + 0x92),(uint)*(byte *)(lVar2 + 0x91),0x10);
      for (blk_idx = 0; bsize_00 = (BLOCK_SIZE)((uint)iVar7 >> 0x18),
          blk_idx < (int)((uint)*(byte *)((long)&(x_00->e_mbd).above_mbmi + 5) *
                         (uint)*(byte *)((long)&(x_00->e_mbd).above_mbmi + 4));
          blk_idx = blk_idx + 1) {
        set_blk_skip((uint8_t *)(in_RSI + 0x24e09),0,blk_idx,(uint)in_R8->skip_txfm);
      }
    }
    if (in_R8->rate == 0x7fffffff) {
      local_4 = 0;
    }
    else {
      av1_merge_rd_stats(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      pRVar8 = (RD_STATS *)
               (((long)(in_RCX->rate + iVar11) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
               in_RCX->dist * 0x80);
      pRVar9 = (RD_STATS *)
               (((long)(in_stack_00000008 + iVar1) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
               in_RCX->sse * 0x80);
      local_f0 = pRVar9;
      if ((long)pRVar8 < (long)pRVar9) {
        local_f0 = pRVar8;
      }
      if (in_stack_00000010 < (long)local_f0) {
        local_4 = 0;
      }
      else {
        av1_init_rd_stats((RD_STATS *)in_R9);
        iVar7 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
        if (1 < iVar7) {
          if (((*(int *)(in_RDI + 0x60aac) != 0) && (in_stack_00000010 != 0x7fffffffffffffff)) &&
             (in_stack_ffffffffffffff00 = pRVar9, (long)pRVar8 < (long)pRVar9)) {
            in_stack_ffffffffffffff00 = pRVar8;
          }
          iVar7 = av1_txfm_uvrd(in_R9,x_00,rd_stats_00,bsize_00,
                                CONCAT44(iVar11,in_stack_ffffffffffffffa8));
          if (iVar7 == 0) {
            return 0;
          }
          av1_merge_rd_stats(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        }
        uVar10 = in_RCX->skip_txfm;
        if (((uVar10 == '\0') &&
            (*(int *)((x_00->e_mbd).weight[6] +
                     (ulong)((byte)*(undefined2 *)(lVar2 + 0xa7) & 7) * 2 + 6) == 0)) &&
           (((long)iVar1 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) + in_RCX->sse * 0x80 <=
            ((long)(in_R8->rate + *(int *)&in_R9->ppi + iVar11) * (long)*(int *)(in_RSI + 0x4218) +
             0x100 >> 9) + in_RCX->dist * 0x80)) {
          uVar10 = '\x01';
        }
        if (uVar10 == '\0') {
          in_RCX->rate = iVar11 + in_RCX->rate;
          *(undefined1 *)(lVar2 + 0x90) = 0;
        }
        else {
          in_R8->rate = 0;
          *(undefined4 *)&in_R9->ppi = 0;
          in_RCX->rate = in_stack_00000008 + iVar1;
          in_RCX->dist = in_RCX->sse;
          in_R8->dist = in_R8->sse;
          pQVar3 = &(in_R9->enc_quant_dequant_params).quants;
          iVar4 = *(int16_t *)((long)(pQVar3->y_quant + 0) + 10);
          iVar5 = *(int16_t *)((long)(pQVar3->y_quant + 0) + 0xc);
          iVar6 = *(int16_t *)((long)(pQVar3->y_quant + 0) + 0xe);
          *(int16_t *)&in_R9->field_0x8 = *(int16_t *)((long)(pQVar3->y_quant + 0) + 8);
          *(int16_t *)&in_R9->field_0xa = iVar4;
          *(int16_t *)&in_R9->field_0xc = iVar5;
          *(int16_t *)&in_R9->field_0xe = iVar6;
          *(undefined1 *)(lVar2 + 0x90) = 1;
          if ((in_RCX->skip_txfm != '\0') &&
             (in_stack_00000010 <
              ((long)in_RCX->rate * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
              in_RCX->dist * 0x80)) {
            return 0;
          }
        }
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int av1_txfm_search(const AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                    RD_STATS *rd_stats, RD_STATS *rd_stats_y,
                    RD_STATS *rd_stats_uv, int mode_rate, int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int skip_txfm_cost[2] = { x->mode_costs.skip_txfm_cost[skip_ctx][0],
                                  x->mode_costs.skip_txfm_cost[skip_ctx][1] };
  const int64_t min_header_rate =
      mode_rate + AOMMIN(skip_txfm_cost[0], skip_txfm_cost[1]);
  // Account for minimum skip and non_skip rd.
  // Eventually either one of them will be added to mode_rate
  const int64_t min_header_rd_possible = RDCOST(x->rdmult, min_header_rate, 0);
  if (min_header_rd_possible > ref_best_rd) {
    av1_invalid_rd_stats(rd_stats_y);
    return 0;
  }

  const AV1_COMMON *cm = &cpi->common;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int64_t mode_rd = RDCOST(x->rdmult, mode_rate, 0);
  const int64_t rd_thresh =
      ref_best_rd == INT64_MAX ? INT64_MAX : ref_best_rd - mode_rd;
  av1_init_rd_stats(rd_stats);
  av1_init_rd_stats(rd_stats_y);
  rd_stats->rate = mode_rate;

  // cost and distortion
  av1_subtract_plane(x, bsize, 0);
  if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
      !xd->lossless[mbmi->segment_id]) {
    av1_pick_recursive_tx_size_type_yrd(cpi, x, rd_stats_y, bsize, rd_thresh);
#if CONFIG_COLLECT_RD_STATS == 2
    PrintPredictionUnitStats(cpi, tile_data, x, rd_stats_y, bsize);
#endif  // CONFIG_COLLECT_RD_STATS == 2
  } else {
    av1_pick_uniform_tx_size_type_yrd(cpi, x, rd_stats_y, bsize, rd_thresh);
    memset(mbmi->inter_tx_size, mbmi->tx_size, sizeof(mbmi->inter_tx_size));
    for (int i = 0; i < xd->height * xd->width; ++i)
      set_blk_skip(x->txfm_search_info.blk_skip, 0, i, rd_stats_y->skip_txfm);
  }

  if (rd_stats_y->rate == INT_MAX) return 0;

  av1_merge_rd_stats(rd_stats, rd_stats_y);

  const int64_t non_skip_txfm_rdcosty =
      RDCOST(x->rdmult, rd_stats->rate + skip_txfm_cost[0], rd_stats->dist);
  const int64_t skip_txfm_rdcosty =
      RDCOST(x->rdmult, mode_rate + skip_txfm_cost[1], rd_stats->sse);
  const int64_t min_rdcosty = AOMMIN(non_skip_txfm_rdcosty, skip_txfm_rdcosty);
  if (min_rdcosty > ref_best_rd) return 0;

  av1_init_rd_stats(rd_stats_uv);
  const int num_planes = av1_num_planes(cm);
  if (num_planes > 1) {
    int64_t ref_best_chroma_rd = ref_best_rd;
    // Calculate best rd cost possible for chroma
    if (cpi->sf.inter_sf.perform_best_rd_based_gating_for_chroma &&
        (ref_best_chroma_rd != INT64_MAX)) {
      ref_best_chroma_rd = (ref_best_chroma_rd -
                            AOMMIN(non_skip_txfm_rdcosty, skip_txfm_rdcosty));
    }
    const int is_cost_valid_uv =
        av1_txfm_uvrd(cpi, x, rd_stats_uv, bsize, ref_best_chroma_rd);
    if (!is_cost_valid_uv) return 0;
    av1_merge_rd_stats(rd_stats, rd_stats_uv);
  }

  int choose_skip_txfm = rd_stats->skip_txfm;
  if (!choose_skip_txfm && !xd->lossless[mbmi->segment_id]) {
    const int64_t rdcost_no_skip_txfm = RDCOST(
        x->rdmult, rd_stats_y->rate + rd_stats_uv->rate + skip_txfm_cost[0],
        rd_stats->dist);
    const int64_t rdcost_skip_txfm =
        RDCOST(x->rdmult, skip_txfm_cost[1], rd_stats->sse);
    if (rdcost_no_skip_txfm >= rdcost_skip_txfm) choose_skip_txfm = 1;
  }
  if (choose_skip_txfm) {
    rd_stats_y->rate = 0;
    rd_stats_uv->rate = 0;
    rd_stats->rate = mode_rate + skip_txfm_cost[1];
    rd_stats->dist = rd_stats->sse;
    rd_stats_y->dist = rd_stats_y->sse;
    rd_stats_uv->dist = rd_stats_uv->sse;
    mbmi->skip_txfm = 1;
    if (rd_stats->skip_txfm) {
      const int64_t tmprd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
      if (tmprd > ref_best_rd) return 0;
    }
  } else {
    rd_stats->rate += skip_txfm_cost[0];
    mbmi->skip_txfm = 0;
  }

  return 1;
}